

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O0

void __thiscall
OctreeTracer::CmdBeamRenderPass
          (OctreeTracer *this,shared_ptr<myvk::CommandBuffer> *command_buffer,uint32_t current_frame
          )

{
  initializer_list<VkClearValue> __l;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l_00;
  initializer_list<VkRect2D> __l_01;
  initializer_list<VkViewport> __l_02;
  uint32_t uVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *__a;
  uint in_EDX;
  long in_RDI;
  float origin_size;
  uint32_t uint_push_constants [3];
  VkViewport viewport;
  VkRect2D scissor;
  uint32_t beam_height;
  uint32_t beam_width;
  value_type *cur;
  uint32_t in_stack_fffffffffffffd48;
  uint32_t in_stack_fffffffffffffd4c;
  Camera *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  uint32_t in_stack_fffffffffffffd5c;
  uint32_t in_stack_fffffffffffffd60;
  VkShaderStageFlags in_stack_fffffffffffffd64;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_stack_fffffffffffffd68;
  CommandBuffer *in_stack_fffffffffffffd70;
  allocator_type *in_stack_fffffffffffffd78;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *in_stack_fffffffffffffd80;
  vector<VkViewport,_std::allocator<VkViewport>_> *this_00;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  VkSubpassContents in_stack_fffffffffffffd94;
  allocator<VkRect2D> *paVar4;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *in_stack_fffffffffffffd98;
  undefined8 ***pppuVar5;
  Ptr<Framebuffer> *in_stack_fffffffffffffda0;
  undefined8 ***pppuVar6;
  Ptr<RenderPass> *in_stack_fffffffffffffda8;
  CommandBuffer *in_stack_fffffffffffffdb0;
  undefined1 local_1c9 [25];
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined8 local_188;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  allocator<VkRect2D> local_169;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_158;
  undefined8 local_150;
  uint32_t local_130;
  uint32_t uStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  uint32_t local_110;
  uint32_t local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  allocator<std::shared_ptr<myvk::DescriptorSet>_> local_d1;
  undefined8 **local_d0;
  undefined1 **local_c8 [2];
  undefined1 local_b8 [16];
  undefined8 **local_a8;
  undefined8 local_a0;
  allocator<VkClearValue> local_59;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 *local_48;
  undefined8 local_40;
  const_reference local_20;
  
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    local_20 = std::
               vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>::
               operator[]((vector<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>
                           *)(in_RDI + 0xb0),(ulong)in_EDX);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x163c5b);
    local_58 = 0;
    local_54 = 0;
    local_50 = 0;
    local_4c = 0x3f800000;
    local_48 = &local_58;
    local_40 = 1;
    std::allocator<VkClearValue>::allocator((allocator<VkClearValue> *)0x163ceb);
    __l._M_len._0_4_ = in_stack_fffffffffffffd90;
    __l._M_array = (iterator)in_stack_fffffffffffffd88;
    __l._M_len._4_4_ = in_stack_fffffffffffffd94;
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::vector
              (in_stack_fffffffffffffd80,__l,(allocator_type *)in_stack_fffffffffffffd78);
    myvk::CommandBuffer::CmdBeginRenderPass
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::~vector
              ((vector<VkClearValue,_std::allocator<VkClearValue>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::allocator<VkClearValue>::~allocator(&local_59);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x163d63);
    std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::GraphicsPipeline,void>
              ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffd50,
               (shared_ptr<myvk::GraphicsPipeline> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    myvk::CommandBuffer::CmdBindPipeline
              ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x163db3);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x163dc0);
    local_d0 = local_c8;
    peVar2 = std::__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x163de9);
    Octree::GetDescriptorSet(peVar2);
    std::shared_ptr<myvk::DescriptorSet>::shared_ptr
              ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd50,
               (shared_ptr<myvk::DescriptorSet> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_d0 = (undefined8 **)local_b8;
    std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x163e39);
    Camera::GetFrameDescriptorSet(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
    std::shared_ptr<myvk::DescriptorSet>::shared_ptr
              ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd50,
               (shared_ptr<myvk::DescriptorSet> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_a8 = local_c8;
    local_a0 = 2;
    std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::allocator
              ((allocator<std::shared_ptr<myvk::DescriptorSet>_> *)0x163e95);
    __l_00._M_len._0_4_ = in_stack_fffffffffffffd90;
    __l_00._M_array = (iterator)in_stack_fffffffffffffd88;
    __l_00._M_len._4_4_ = in_stack_fffffffffffffd94;
    std::
    vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
    ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              *)in_stack_fffffffffffffd80,__l_00,(allocator_type *)in_stack_fffffffffffffd78);
    std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::GraphicsPipeline,void>
              ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffd50,
               (shared_ptr<myvk::GraphicsPipeline> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x163f03);
    myvk::CommandBuffer::CmdBindDescriptorSets
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x163f3e);
    std::
    vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
    ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
               *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::~allocator(&local_d1);
    pppuVar6 = (undefined8 ***)local_c8;
    pppuVar5 = &local_a8;
    do {
      pppuVar5 = pppuVar5 + -2;
      std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x163f81)
      ;
    } while (pppuVar5 != pppuVar6);
    local_10c = get_beam_size(*(uint32_t *)(in_RDI + 8));
    uStack_12c = get_beam_size(*(uint32_t *)(in_RDI + 0xc));
    local_128 = 0;
    local_130 = local_10c;
    uStack_120 = CONCAT44(uStack_12c,local_10c);
    local_110 = uStack_12c;
    peVar3 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x164009);
    local_168 = local_128;
    uStack_160 = uStack_120;
    local_158 = &local_168;
    local_150 = 1;
    paVar4 = &local_169;
    std::allocator<VkRect2D>::allocator((allocator<VkRect2D> *)0x16404c);
    __l_01._M_len._0_4_ = (int)paVar4;
    __l_01._M_array = (iterator)peVar3;
    __l_01._M_len._4_4_ = (int)((ulong)paVar4 >> 0x20);
    std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
              ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)in_stack_fffffffffffffd80,__l_01,
               in_stack_fffffffffffffd78);
    myvk::CommandBuffer::CmdSetScissor
              ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (vector<VkRect2D,_std::allocator<VkRect2D>_> *)
               CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::vector<VkRect2D,_std::allocator<VkRect2D>_>::~vector
              ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::allocator<VkRect2D>::~allocator(&local_169);
    local_188 = 0;
    local_178 = 0;
    fStack_17c = (float)local_110;
    fStack_180 = (float)local_10c;
    __a = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1640ec);
    local_1c9._17_8_ = local_178;
    local_1c9._1_8_ = local_188;
    local_1c9._9_8_ = _fStack_180;
    local_1b0 = local_1c9 + 1;
    local_1a8 = 1;
    this_00 = (vector<VkViewport,_std::allocator<VkViewport>_> *)local_1c9;
    std::allocator<VkViewport>::allocator((allocator<VkViewport> *)0x16413f);
    __l_02._M_len._0_4_ = (int)paVar4;
    __l_02._M_array = (iterator)peVar3;
    __l_02._M_len._4_4_ = (int)((ulong)paVar4 >> 0x20);
    std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
              (this_00,__l_02,(allocator_type *)__a);
    myvk::CommandBuffer::CmdSetViewport
              ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (vector<VkViewport,_std::allocator<VkViewport>_> *)
               CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::vector<VkViewport,_std::allocator<VkViewport>_>::~vector
              ((vector<VkViewport,_std::allocator<VkViewport>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::allocator<VkViewport>::~allocator((allocator<VkViewport> *)local_1c9);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1641c5);
    myvk::CommandBuffer::CmdPushConstants
              (in_stack_fffffffffffffd70,(Ptr<PipelineLayout> *)in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
               in_stack_fffffffffffffd50);
    peVar2 = std::__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1641ff);
    uVar1 = Octree::GetLevel(peVar2);
    exp2f(1.0 - (float)uVar1);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x164235);
    myvk::CommandBuffer::CmdPushConstants
              (in_stack_fffffffffffffd70,(Ptr<PipelineLayout> *)in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
               in_stack_fffffffffffffd50);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x16426e);
    myvk::CommandBuffer::CmdDraw
              ((CommandBuffer *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
               in_stack_fffffffffffffd48,0,0x164286);
    std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x164293);
    myvk::CommandBuffer::CmdEndRenderPass((CommandBuffer *)0x16429b);
  }
  return;
}

Assistant:

void OctreeTracer::CmdBeamRenderPass(const std::shared_ptr<myvk::CommandBuffer> &command_buffer,
                                     uint32_t current_frame) const {
	if (!m_beam_enable)
		return;
	const auto &cur = m_frame_resources[current_frame];
	command_buffer->CmdBeginRenderPass(m_beam_render_pass, cur.m_beam_framebuffer, {{{0.0f, 0.0f, 0.0f, 1.0f}}});
	command_buffer->CmdBindPipeline(m_beam_graphics_pipeline);
	command_buffer->CmdBindDescriptorSets(
	    {m_octree_ptr->GetDescriptorSet(), m_camera_ptr->GetFrameDescriptorSet(current_frame)},
	    m_beam_graphics_pipeline);

	uint32_t beam_width = get_beam_size(m_width), beam_height = get_beam_size(m_height);
	VkRect2D scissor = {};
	scissor.extent = {beam_width, beam_height};
	command_buffer->CmdSetScissor({scissor});
	VkViewport viewport = {};
	viewport.width = beam_width;
	viewport.height = beam_height;
	command_buffer->CmdSetViewport({viewport});

	uint32_t uint_push_constants[] = {m_width, m_height, kBeamSize};
	command_buffer->CmdPushConstants(m_beam_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, 0,
	                                 sizeof(uint_push_constants), uint_push_constants);
	float origin_size = exp2f(1.0f - m_octree_ptr->GetLevel());
	command_buffer->CmdPushConstants(m_beam_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, sizeof(uint_push_constants),
	                                 sizeof(float), &origin_size);
	command_buffer->CmdDraw(3, 1, 0, 0);
	command_buffer->CmdEndRenderPass();
}